

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O3

void __thiscall Assimp::STLExporter::WriteMesh(STLExporter *this,aiMesh *m)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  aiVector3D *paVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  aiFace *paVar8;
  float fVar9;
  float local_6c;
  float local_68;
  float fStack_64;
  
  if (m->mNumFaces != 0) {
    uVar6 = 0;
    do {
      paVar8 = m->mFaces + uVar6;
      paVar4 = m->mNormals;
      if (paVar4 == (aiVector3D *)0x0) {
        local_68 = 0.0;
        fStack_64 = 0.0;
        local_6c = 0.0;
      }
      else {
        if ((ulong)paVar8->mNumIndices == 0) {
          local_68 = 0.0;
          fStack_64 = 0.0;
          local_6c = 0.0;
        }
        else {
          local_68 = 0.0;
          fStack_64 = 0.0;
          local_6c = 0.0;
          uVar7 = 0;
          do {
            uVar1 = paVar4[paVar8->mIndices[uVar7]].x;
            uVar2 = paVar4[paVar8->mIndices[uVar7]].y;
            local_68 = local_68 + (float)uVar1;
            fStack_64 = fStack_64 + (float)uVar2;
            local_6c = local_6c + paVar4[paVar8->mIndices[uVar7]].z;
            uVar7 = uVar7 + 1;
          } while (paVar8->mNumIndices != uVar7);
        }
        fVar9 = SQRT(local_6c * local_6c + local_68 * local_68 + fStack_64 * fStack_64);
        if (0.0 < fVar9) {
          fVar9 = 1.0 / fVar9;
          local_6c = local_6c * fVar9;
          local_68 = local_68 * fVar9;
          fStack_64 = fStack_64 * fVar9;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," facet normal ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)local_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      poVar5 = std::ostream::_M_insert<double>((double)fStack_64);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      poVar5 = std::ostream::_M_insert<double>((double)local_6c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  outer loop",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      if (paVar8->mNumIndices != 0) {
        uVar7 = 0;
        do {
          paVar4 = m->mVertices;
          uVar3 = paVar8->mIndices[uVar7];
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  vertex ",9);
          poVar5 = std::ostream::_M_insert<double>((double)paVar4[uVar3].x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          poVar5 = std::ostream::_M_insert<double>((double)paVar4[uVar3].y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          poVar5 = std::ostream::_M_insert<double>((double)paVar4[uVar3].z);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
          uVar7 = uVar7 + 1;
        } while (uVar7 < paVar8->mNumIndices);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  endloop",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," endfacet",9);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this,(this->endl)._M_dataplus._M_p,
                          (this->endl)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      uVar6 = uVar6 + 1;
    } while (uVar6 < m->mNumFaces);
  }
  return;
}

Assistant:

void STLExporter::WriteMesh(const aiMesh* m)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];

        // we need per-face normals. We specified aiProcess_GenNormals as pre-requisite for this exporter,
        // but nonetheless we have to expect per-vertex normals.
        aiVector3D nor;
        if (m->mNormals) {
            for(unsigned int a = 0; a < f.mNumIndices; ++a) {
                nor += m->mNormals[f.mIndices[a]];
            }
            nor.NormalizeSafe();
        }
        mOutput << " facet normal " << nor.x << " " << nor.y << " " << nor.z << endl;
        mOutput << "  outer loop" << endl;
        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            const aiVector3D& v  = m->mVertices[f.mIndices[a]];
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
        }

        mOutput << "  endloop" << endl;
        mOutput << " endfacet" << endl << endl;
    }
}